

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btTetrahedronShape.cpp
# Opt level: O3

int __thiscall btBU_Simplex1to4::getNumPlanes(btBU_Simplex1to4 *this)

{
  int iVar1;
  int iVar2;
  
  iVar1 = *(int *)&(this->super_btPolyhedralConvexAabbCachingShape).field_0x74;
  iVar2 = (uint)(iVar1 == 3) * 2;
  if (iVar1 == 4) {
    iVar2 = 4;
  }
  return iVar2;
}

Assistant:

int	btBU_Simplex1to4::getNumPlanes() const
{
	switch (m_numVertices)
	{
	case 0:
			return 0;
	case 1:
			return 0;
	case 2:
			return 0;
	case 3:
			return 2;
	case 4:
			return 4;
	default:
		{
		}
	}
	return 0;
}